

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

void Imf_3_4::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  LevelMode LVar1;
  int iVar2;
  int *piVar3;
  ArgExc *this;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  LevelRoundingMode local_5c;
  
  LVar1 = tileDesc->mode;
  if (LVar1 == RIPMAP_LEVELS) {
    local_5c = tileDesc->roundingMode;
    iVar5 = anon_unknown_13::roundLog2((maxX - minX) + 1,local_5c);
    *numXLevels = iVar5 + 1;
    iVar5 = anon_unknown_13::roundLog2((maxY - minY) + 1,local_5c);
    uVar4 = iVar5 + 1;
  }
  else if (LVar1 == MIPMAP_LEVELS) {
    iVar2 = (maxX - minX) + 1;
    iVar5 = (maxY - minY) + 1;
    if (iVar5 < iVar2) {
      iVar5 = iVar2;
    }
    local_5c = tileDesc->roundingMode;
    iVar5 = anon_unknown_13::roundLog2(iVar5,local_5c);
    uVar4 = iVar5 + 1;
    *numXLevels = uVar4;
  }
  else {
    if (LVar1 != ONE_LEVEL) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown LevelMode format.");
      __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    *numXLevels = 1;
    local_5c = tileDesc->roundingMode;
    uVar4 = 1;
  }
  *numYLevels = uVar4;
  iVar5 = *numXLevels;
  uVar6 = (long)iVar5 * 4;
  if ((long)iVar5 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar6);
  *numXTiles = piVar3;
  uVar6 = (ulong)uVar4 << 2;
  if ((int)uVar4 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar6);
  *numYTiles = piVar3;
  anon_unknown_13::calculateNumTiles(*numXTiles,iVar5,minX,maxX,tileDesc->xSize,local_5c);
  anon_unknown_13::calculateNumTiles
            (*numYTiles,*numYLevels,minY,maxY,tileDesc->ySize,tileDesc->roundingMode);
  return;
}

Assistant:

void
precalculateTileInfo (
    const TileDescription& tileDesc,
    int                    minX,
    int                    maxX,
    int                    minY,
    int                    maxY,
    int*&                  numXTiles,
    int*&                  numYTiles,
    int&                   numXLevels,
    int&                   numYLevels)
{
    numXLevels = calculateNumXLevels (tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels (tileDesc, minX, maxX, minY, maxY);

    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (
        numXTiles,
        numXLevels,
        minX,
        maxX,
        tileDesc.xSize,
        tileDesc.roundingMode);

    calculateNumTiles (
        numYTiles,
        numYLevels,
        minY,
        maxY,
        tileDesc.ySize,
        tileDesc.roundingMode);
}